

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O0

Bool prvTidyAttributeIsMismatched(Node *node,AttVal *attval,TidyDocImpl *doc)

{
  uint uVar1;
  uint local_30;
  uint doctype;
  TidyDocImpl *doc_local;
  AttVal *attval_local;
  Node *node_local;
  
  if ((node == (Node *)0x0) || (attval == (AttVal *)0x0)) {
    node_local._4_4_ = no;
  }
  else if (node->tag == (Dict *)0x0) {
    node_local._4_4_ = no;
  }
  else if ((node->tag->versions & 0x61fff) == 0) {
    node_local._4_4_ = no;
  }
  else {
    if (doc->lexer->versionEmitted == 0) {
      local_30 = doc->lexer->doctype;
    }
    else {
      local_30 = doc->lexer->versionEmitted;
    }
    uVar1 = AttributeVersions(node,attval);
    if ((uVar1 & local_30) == 0) {
      node_local._4_4_ = yes;
    }
    else {
      node_local._4_4_ = no;
    }
  }
  return node_local._4_4_;
}

Assistant:

Bool TY_(AttributeIsMismatched)(Node* node, AttVal* attval, TidyDocImpl* doc)
{
    uint doctype;
    
    if (!node || !attval)
        return no;
    
    if (!node->tag)
        return no;
    
    if (!(node->tag->versions & VERS_ALL))
        return no;

    doctype = doc->lexer->versionEmitted == 0 ? doc->lexer->doctype : doc->lexer->versionEmitted;

    if (AttributeVersions(node, attval) & doctype)
        return no;
    
    return yes;
}